

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::SignBitFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  ScalarFunctionSet *in_RDI;
  ScalarFunctionSet *funcs;
  allocator_type *in_stack_fffffffffffffb88;
  ScalarFunction *pSVar3;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffb90;
  ScalarFunction *pSVar4;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffb98;
  LogicalType *__f;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffba4;
  LogicalType *local_3e8;
  LogicalType *local_3c8;
  LogicalType local_3a8 [24];
  undefined1 local_390 [32];
  LogicalType local_370 [32];
  LogicalType *local_350;
  LogicalType local_348 [24];
  LogicalType *local_330;
  undefined8 local_328;
  undefined1 local_320 [24];
  ScalarFunction local_308;
  LogicalType local_1e0 [24];
  undefined1 local_1c8 [32];
  LogicalType local_1a8 [40];
  LogicalType *local_180;
  LogicalType local_178 [24];
  LogicalType *local_160;
  undefined8 local_158;
  undefined1 local_150 [24];
  ScalarFunction local_138;
  undefined1 local_9;
  
  local_9 = 0;
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  local_180 = local_178;
  duckdb::LogicalType::LogicalType(local_180,FLOAT);
  local_160 = local_178;
  local_158 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xdca0bc);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffba0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffb98;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffba4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffb90,iVar1,in_stack_fffffffffffffb88);
  duckdb::LogicalType::LogicalType(local_1a8,BOOLEAN);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98
            );
  duckdb::LogicalType::LogicalType(local_1e0,INVALID);
  __f = local_1e0;
  uVar5 = 0;
  pSVar4 = (ScalarFunction *)0x0;
  pSVar3 = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_138,local_150,local_1a8,local_1c8,0);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar4,pSVar3);
  ScalarFunction::~ScalarFunction(pSVar4);
  duckdb::LogicalType::~LogicalType(local_1e0);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xdca1bd);
  duckdb::LogicalType::~LogicalType(local_1a8);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xdca1d7);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xdca1e4);
  local_3c8 = (LogicalType *)&local_160;
  do {
    local_3c8 = local_3c8 + -0x18;
    duckdb::LogicalType::~LogicalType(local_3c8);
  } while (local_3c8 != local_178);
  local_350 = local_348;
  duckdb::LogicalType::LogicalType(local_350,DOUBLE);
  local_330 = local_348;
  local_328 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xdca283);
  iVar2._M_len._0_4_ = uVar5;
  iVar2._M_array = __f;
  iVar2._M_len._4_4_ = in_stack_fffffffffffffba4;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar4,iVar2,(allocator_type *)pSVar3);
  duckdb::LogicalType::LogicalType(local_370,BOOLEAN);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffba4,uVar5),
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)__f);
  duckdb::LogicalType::LogicalType(local_3a8,INVALID);
  pSVar4 = (ScalarFunction *)0x0;
  pSVar3 = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_308,local_320,local_370,local_390,0);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar4,pSVar3);
  ScalarFunction::~ScalarFunction(pSVar4);
  duckdb::LogicalType::~LogicalType(local_3a8);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xdca384);
  duckdb::LogicalType::~LogicalType(local_370);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xdca39e);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xdca3ab);
  local_3e8 = (LogicalType *)&local_330;
  do {
    local_3e8 = local_3e8 + -0x18;
    duckdb::LogicalType::~LogicalType(local_3e8);
  } while (local_3e8 != local_348);
  return in_RDI;
}

Assistant:

ScalarFunctionSet SignBitFun::GetFunctions() {
	ScalarFunctionSet funcs;
	funcs.AddFunction(ScalarFunction({LogicalType::FLOAT}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<float, bool, SignBitOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::DOUBLE}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<double, bool, SignBitOperator>));
	return funcs;
}